

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticLine>::Write
          (TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *this,TPZStream *buf,int withclassid)

{
  long lVar1;
  
  TPZGeoEl::Write(&this->super_TPZGeoEl,buf,withclassid);
  pzgeom::TPZNodeRep<3,_pztopology::TPZLine>::Write
            (&(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>,buf,withclassid);
  for (lVar1 = 0; lVar1 != 0x48; lVar1 = lVar1 + 0x18) {
    (**(code **)(*(long *)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) +
                0x28))((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1,buf,
                       withclassid);
  }
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}